

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O0

CommandSignature __thiscall llbuild::buildsystem::Command::getSignature(Command *this)

{
  CommandSignature *pCVar1;
  CommandSignature local_20;
  Command *local_18;
  Command *this_local;
  
  local_18 = this;
  memset(&local_20,0,8);
  basic::CommandSignature::CommandSignature(&local_20);
  pCVar1 = basic::CommandSignature::combine(&local_20,&this->name);
  return (CommandSignature)pCVar1->value;
}

Assistant:

basic::CommandSignature Command::getSignature() const {
  return basic::CommandSignature().combine(name);
}